

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::CopyPropDstUses(GlobOpt *this,Opnd *opnd,Instr *instr,Value *src1Val)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  ValueType *pVVar6;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  if (OVar2 == OpndKindSym) {
    OVar2 = IR::Opnd::GetKind(opnd);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (*(char *)((long)opnd[1]._vptr_Opnd + 0x14) == '\x02') {
      pVVar5 = GlobOptBlockData::FindValue
                         (&this->currentBlock->globOptData,(Sym *)opnd[1]._vptr_Opnd[4]);
      if (pVVar5 == (Value *)0x0) {
        pVVar6 = &ValueType::Uninitialized;
      }
      else {
        pVVar6 = &pVVar5->valueInfo->super_ValueType;
      }
      *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&opnd[1].m_kind = pVVar6->field_0;
      CopyPropPropertySymObj(this,(SymOpnd *)opnd,instr);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::CopyPropDstUses(IR::Opnd *opnd, IR::Instr *instr, Value *src1Val)
{
    if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym * originalPropertySym = symOpnd->m_sym->AsPropertySym();

            Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
            symOpnd->SetPropertyOwnerValueType(objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

            this->CopyPropPropertySymObj(symOpnd, instr);
        }
    }
}